

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

string * __thiscall mocker::Lexer::nextToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  local_90;
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  local_70;
  undefined1 local_49;
  undefined1 local_48 [8];
  Position tmpNxtPos;
  Position tmpCurPos;
  StrIter tmpNxtBeg;
  StrIter tmpCurBeg;
  Lexer *this_local;
  string *res;
  
  tmpNxtBeg._M_current = (this->curBeg)._M_current;
  tmpCurPos.col = (size_t)(this->nxtBeg)._M_current;
  tmpNxtPos.col = (this->curPos).line;
  tmpCurPos.line = (this->curPos).col;
  local_48 = (undefined1  [8])(this->nxtPos).line;
  tmpNxtPos.line = (this->nxtPos).col;
  local_49 = 0;
  getToken_abi_cxx11_(__return_storage_ptr__,this);
  std::
  tie<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,mocker::Position,mocker::Position>
            (&local_70,&tmpNxtBeg,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpCurPos.col,(Position *)&tmpNxtPos.col,(Position *)local_48);
  std::
  tie<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,mocker::Position,mocker::Position>
            (&local_90,&this->curBeg,&this->nxtBeg,&this->curPos,&this->nxtPos);
  std::
  tuple<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_mocker::Position_&,_mocker::Position_&>
  ::operator=(&local_90,&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string Lexer::nextToken() {
  auto tmpCurBeg = curBeg;
  auto tmpNxtBeg = nxtBeg;
  auto tmpCurPos = curPos;
  auto tmpNxtPos = nxtPos;
  auto res = getToken();
  std::tie(curBeg, nxtBeg, curPos, nxtPos) =
      std::tie(tmpCurBeg, tmpNxtBeg, tmpCurPos, tmpNxtPos);
  return res;
}